

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_asn1.cc
# Opt level: O2

EC_KEY * d2i_EC_PUBKEY(EC_KEY **a,uchar **pp,long length)

{
  ec_key_st *peVar1;
  pointer __p;
  UniquePtr<EC_KEY> ec_key;
  UniquePtr<EVP_PKEY> pkey;
  CBS cbs;
  _Head_base<0UL,_ec_key_st_*,_false> local_38;
  _Head_base<0UL,_evp_pkey_st_*,_false> local_30;
  CBS local_28;
  
  if (length < 0) {
    peVar1 = (ec_key_st *)0x0;
  }
  else {
    local_28.data = *pp;
    local_28.len = length;
    local_30._M_head_impl = EVP_parse_public_key(&local_28);
    if ((EVP_PKEY *)local_30._M_head_impl == (EVP_PKEY *)0x0) {
      peVar1 = (ec_key_st *)0x0;
    }
    else {
      peVar1 = (ec_key_st *)EVP_PKEY_get1_EC_KEY((EVP_PKEY *)local_30._M_head_impl);
      local_38._M_head_impl = peVar1;
      if (peVar1 != (ec_key_st *)0x0) {
        if (a != (EC_KEY **)0x0) {
          EC_KEY_free(*a);
          *a = (EC_KEY *)peVar1;
        }
        *pp = local_28.data;
        local_38._M_head_impl = (ec_key_st *)0x0;
      }
      std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<ec_key_st,_bssl::internal::Deleter> *)&local_38);
    }
    std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&local_30);
  }
  return (EC_KEY *)peVar1;
}

Assistant:

EC_KEY *d2i_EC_PUBKEY(EC_KEY **out, const uint8_t **inp, long len) {
  if (len < 0) {
    return nullptr;
  }
  CBS cbs;
  CBS_init(&cbs, *inp, (size_t)len);
  bssl::UniquePtr<EVP_PKEY> pkey(EVP_parse_public_key(&cbs));
  if (pkey == nullptr) {
    return nullptr;
  }
  bssl::UniquePtr<EC_KEY> ec_key(EVP_PKEY_get1_EC_KEY(pkey.get()));
  if (ec_key == nullptr) {
    return nullptr;
  }
  if (out != nullptr) {
    EC_KEY_free(*out);
    *out = ec_key.get();
  }
  *inp = CBS_data(&cbs);
  return ec_key.release();
}